

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::BuildIntersectList(Clipper *this,cInt topY)

{
  pointer *pppIVar1;
  iterator __position;
  bool bVar2;
  TEdge *pTVar3;
  long lVar4;
  TEdge *pTVar5;
  TEdge *pTVar6;
  double dVar7;
  IntersectNode *newNode;
  IntPoint local_48;
  IntersectNode *local_38;
  
  pTVar3 = *(TEdge **)
            (this->_vptr_Clipper[-3] + 0x10 +
            (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  if (pTVar3 != (TEdge *)0x0) {
    this->m_SortedEdges = pTVar3;
    do {
      pTVar3->PrevInSEL = pTVar3->PrevInAEL;
      lVar4 = (pTVar3->Top).Y;
      pTVar5 = pTVar3->NextInAEL;
      pTVar3->NextInSEL = pTVar5;
      if (lVar4 == topY) {
        lVar4 = (pTVar3->Top).X;
      }
      else {
        dVar7 = (double)(topY - (pTVar3->Bot).Y) * pTVar3->Dx;
        lVar4 = (long)(dVar7 + *(double *)(&DAT_0011d070 + (ulong)(dVar7 < 0.0) * 8)) +
                (pTVar3->Bot).X;
      }
      (pTVar3->Curr).X = lVar4;
      pTVar3 = pTVar5;
    } while (pTVar5 != (TEdge *)0x0);
    while( true ) {
      pTVar3 = this->m_SortedEdges;
      pTVar5 = pTVar3->NextInSEL;
      if (pTVar5 == (TEdge *)0x0) break;
      bVar2 = false;
      do {
        local_48.X = 0;
        local_48.Y = 0;
        pTVar6 = pTVar5;
        if ((pTVar5->Curr).X < (pTVar3->Curr).X) {
          IntersectPoint(pTVar3,pTVar5,&local_48);
          if (local_48.Y < topY) {
            local_48.Y = topY;
            if ((pTVar3->Top).Y == topY) {
              local_48.X = (pTVar3->Top).X;
            }
            else {
              dVar7 = (double)(topY - (pTVar3->Bot).Y) * pTVar3->Dx;
              local_48.X = (long)(dVar7 + *(double *)(&DAT_0011d070 + (ulong)(dVar7 < 0.0) * 8)) +
                           (pTVar3->Bot).X;
            }
          }
          local_38 = (IntersectNode *)operator_new(0x20);
          local_38->Edge1 = pTVar3;
          local_38->Edge2 = pTVar5;
          (local_38->Pt).X = local_48.X;
          (local_38->Pt).Y = local_48.Y;
          __position._M_current =
               (this->m_IntersectList).
               super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_IntersectList).
              super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntersectNode*,std::allocator<ClipperLib::IntersectNode*>>::
            _M_realloc_insert<ClipperLib::IntersectNode*const&>
                      ((vector<ClipperLib::IntersectNode*,std::allocator<ClipperLib::IntersectNode*>>
                        *)&this->m_IntersectList,__position,&local_38);
          }
          else {
            *__position._M_current = local_38;
            pppIVar1 = &(this->m_IntersectList).
                        super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppIVar1 = *pppIVar1 + 1;
          }
          SwapPositionsInSEL(this,pTVar3,pTVar5);
          bVar2 = true;
          pTVar6 = pTVar3;
        }
        pTVar5 = pTVar6->NextInSEL;
        pTVar3 = pTVar6;
      } while (pTVar5 != (TEdge *)0x0);
      if ((pTVar6->PrevInSEL == (TEdge *)0x0) ||
         (pTVar6->PrevInSEL->NextInSEL = (TEdge *)0x0, !bVar2)) goto LAB_00112b42;
    }
    if (pTVar3->PrevInSEL != (TEdge *)0x0) {
      pTVar3->PrevInSEL->NextInSEL = (TEdge *)0x0;
    }
LAB_00112b42:
    this->m_SortedEdges = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::BuildIntersectList(const cInt topY)
{
  if ( !m_ActiveEdges ) return;

  //prepare for sorting ...
  TEdge* e = m_ActiveEdges;
  m_SortedEdges = e;
  while( e )
  {
    e->PrevInSEL = e->PrevInAEL;
    e->NextInSEL = e->NextInAEL;
    e->Curr.X = TopX( *e, topY );
    e = e->NextInAEL;
  }

  //bubblesort ...
  bool isModified;
  do
  {
    isModified = false;
    e = m_SortedEdges;
    while( e->NextInSEL )
    {
      TEdge *eNext = e->NextInSEL;
      IntPoint Pt;
      if(e->Curr.X > eNext->Curr.X)
      {
        IntersectPoint(*e, *eNext, Pt);
        if (Pt.Y < topY) Pt = IntPoint(TopX(*e, topY), topY);
        IntersectNode * newNode = new IntersectNode;
        newNode->Edge1 = e;
        newNode->Edge2 = eNext;
        newNode->Pt = Pt;
        m_IntersectList.push_back(newNode);

        SwapPositionsInSEL(e, eNext);
        isModified = true;
      }
      else
        e = eNext;
    }
    if( e->PrevInSEL ) e->PrevInSEL->NextInSEL = 0;
    else break;
  }
  while ( isModified );
  m_SortedEdges = 0; //important
}